

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O2

void __thiscall fc_layer_t::activate(fc_layer_t *this)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int i;
  int _x;
  int n;
  long lVar4;
  int _y;
  int z;
  int _z;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 local_58 [16];
  
  for (lVar4 = 0; lVar4 < (this->super_layer_t).out.size.x; lVar4 = lVar4 + 1) {
    local_58 = ZEXT816(0) << 0x40;
    for (_x = 0; _x < (this->super_layer_t).in.size.x; _x = _x + 1) {
      for (_y = 0; _y < (this->super_layer_t).in.size.y; _y = _y + 1) {
        for (_z = 0; _z < (this->super_layer_t).in.size.z; _z = _z + 1) {
          iVar1 = (this->super_layer_t).in.size.y;
          iVar2 = (this->super_layer_t).in.size.x;
          pfVar3 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,_z);
          fVar6 = *pfVar3;
          pfVar3 = tensor_t<float>::get(&this->weights,(iVar1 * _z + _y) * iVar2 + _x,(int)lVar4,0);
          local_58 = vfmadd231ss_fma(local_58,ZEXT416((uint)fVar6),ZEXT416((uint)*pfVar3));
        }
      }
    }
    (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = local_58._0_4_;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(local_58,auVar5);
    fVar6 = expf(auVar5._0_4_);
    pfVar3 = tensor_t<float>::get(&(this->super_layer_t).out,(int)lVar4,0,0);
    *pfVar3 = 1.0 / (fVar6 + 1.0);
  }
  return;
}

Assistant:

void activate() {
    for (int n = 0; n < out.size.x; n++) {
      float inputv = 0;

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            inputv += in(i, j, z) * weights(m, n, 0);
          }

      input[n] = inputv;

      // activate function
      out(n, 0, 0) = activator_function(inputv);
    }
  }